

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messages.c
# Opt level: O1

void doprev_message(void)

{
  nh_menuitem_conflict *pnVar1;
  uint uVar2;
  char *pcVar3;
  bool bVar4;
  nh_menuitem_conflict *items;
  size_t sVar5;
  wchar_t wVar6;
  uint uVar7;
  long lVar8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  wchar_t wVar12;
  wchar_t width;
  long lVar13;
  wchar_t output_count;
  char **output;
  char buf [120];
  wchar_t local_e4;
  wchar_t local_d4;
  char **local_d0;
  wchar_t local_c8;
  uint local_c4;
  long local_c0;
  ulong local_b8;
  ulong local_b0;
  char local_a8 [120];
  
  iVar9 = 0;
  uVar10 = 0;
  if (L'\0' < histsize) {
    uVar10 = 0;
    wVar12 = L'\0';
    do {
      if ((int)uVar10 < msghistory[(histpos + L'\x01' + wVar12) % histsize].turn) {
        uVar10 = msghistory[(histpos + L'\x01' + wVar12) % histsize].turn;
      }
      wVar12 = wVar12 + L'\x01';
    } while (histsize != wVar12);
  }
  if (uVar10 != 0) {
    iVar9 = 0;
    do {
      iVar9 = iVar9 + 1;
      bVar4 = 9 < uVar10;
      uVar10 = uVar10 / 10;
    } while (bVar4);
  }
  uVar10 = iVar9 + (uint)(iVar9 == 0);
  items = (nh_menuitem_conflict *)malloc(0xa78);
  if (histsize < L'\x01') {
    wVar12 = L'\0';
  }
  else {
    width = L'I' - uVar10;
    local_b0 = (ulong)width;
    local_e4 = L'\n';
    uVar7 = 0;
    uVar11 = 0;
    wVar12 = L'\0';
    local_c8 = width;
    local_c4 = uVar10;
    do {
      iVar9 = (histpos + (int)uVar11 + 1) % histsize;
      uVar2 = msghistory[iVar9].turn;
      if (uVar2 != 0) {
        pcVar3 = msghistory[iVar9].msg;
        local_b8 = uVar11;
        sVar5 = strlen(pcVar3);
        local_c0 = (long)wVar12;
        if (local_b0 < sVar5) {
          ui_wrap_text(width,pcVar3,&local_d4,&local_d0);
          if (uVar2 == uVar7) {
            snprintf(local_a8,0x78,"\t%s",*local_d0);
          }
          else {
            snprintf(local_a8,0x78,"T:%*d\t%s",(ulong)uVar10);
          }
          if (local_e4 <= wVar12) {
            local_e4 = local_e4 * 2;
            items = (nh_menuitem_conflict *)realloc(items,(long)local_e4 * 0x10c);
          }
          pnVar1 = items + local_c0;
          pnVar1->id = L'\0';
          pnVar1->role = MI_TEXT;
          pnVar1->accel = '\0';
          pnVar1->group_accel = '\0';
          pnVar1->selected = '\0';
          strcpy(pnVar1->caption,local_a8);
          wVar6 = wVar12 + L'\x01';
          if (L'\x01' < local_d4) {
            lVar13 = (long)wVar6 * 0x10c + 0x10a;
            lVar8 = 1;
            do {
              snprintf(local_a8,0x78,"\t%s",local_d0[lVar8]);
              if ((long)local_e4 <= lVar8 + wVar6 + -1) {
                local_e4 = local_e4 * 2;
                items = (nh_menuitem_conflict *)realloc(items,(long)local_e4 * 0x10c);
              }
              pcVar3 = items->caption + lVar13 + -8;
              *(undefined8 *)(pcVar3 + -0x10a) = 0;
              *(undefined2 *)(pcVar3 + -2) = MI_TEXT >> 0x10;
              *pcVar3 = '\0';
              strcpy(pcVar3 + -0x102,local_a8);
              lVar8 = lVar8 + 1;
              lVar13 = lVar13 + 0x10c;
            } while (lVar8 < local_d4);
            wVar6 = wVar12 + (int)lVar8;
            uVar10 = local_c4;
            width = local_c8;
          }
          ui_free_wrap(local_d0);
          uVar11 = local_b8;
          uVar7 = uVar2;
          wVar12 = wVar6;
        }
        else {
          if (uVar2 == uVar7) {
            snprintf(local_a8,0x78,"\t%s",pcVar3);
          }
          else {
            snprintf(local_a8,0x78,"T:%*d\t%s",(ulong)uVar10,(ulong)uVar2,pcVar3);
          }
          if (local_e4 <= wVar12) {
            local_e4 = local_e4 * 2;
            items = (nh_menuitem_conflict *)realloc(items,(long)local_e4 * 0x10c);
          }
          pnVar1 = items + local_c0;
          pnVar1->id = L'\0';
          pnVar1->role = MI_TEXT;
          pnVar1->accel = '\0';
          pnVar1->group_accel = '\0';
          pnVar1->selected = '\0';
          strcpy(pnVar1->caption,local_a8);
          wVar12 = wVar12 + L'\x01';
          uVar11 = local_b8;
          uVar7 = uVar2;
        }
      }
      wVar6 = (int)uVar11 + L'\x01';
      uVar11 = (ulong)(uint)wVar6;
    } while (wVar6 < histsize);
  }
  curses_display_menu_bottom(items,wVar12,"Message history:",L'\0',(wchar_t *)0x0);
  free(items);
  return;
}

Assistant:

void doprev_message(void)
{
    /* 80 chars - 2 (borders) - 2 (gutters) - "T:" - 1 (divider) */
    const int hist_msg_width = 73;

    int prevturn;
    int pos;
    int maxturn, maxturn_width;

    struct nh_menuitem *items;
    char buf[MSGLEN+1];
    int icount, size, i;

    /* keep the previous messages window within 80 characters */
    maxturn = 0;
    for (i = 0; i < histsize; i++) {
	pos = (histpos + i + 1) % histsize;
	if (msghistory[pos].turn > maxturn)
	    maxturn = msghistory[pos].turn;
    }
    maxturn_width = 0;
    while (maxturn) {
	maxturn_width++;
	maxturn /= 10;
    }
    if (maxturn_width < 1)
	maxturn_width = 1;

    /* Prevent duplicate turn stamps. */
    prevturn = 0;

    icount = 0;
    size = 10;
    items = malloc(size * sizeof(struct nh_menuitem));

    for (i = 0; i < histsize; i++) {
	int turn;
	const char *msg;

	pos = (histpos + i + 1) % histsize;

	if (!msghistory[pos].turn)
	    continue;

	turn = msghistory[pos].turn;
	msg = msghistory[pos].msg;

	if (strlen(msg) <= hist_msg_width - maxturn_width) {
	    if (turn != prevturn)
		snprintf(buf, MSGLEN+1, "T:%*d\t%s", maxturn_width, turn, msg);
	    else
		snprintf(buf, MSGLEN+1, "\t%s", msg);
	    add_menu_txt(items, size, icount, buf, MI_TEXT);
	} else {
	    int output_count, j;
	    char **output;

	    ui_wrap_text(hist_msg_width - maxturn_width, msg, &output_count, &output);

	    if (turn != prevturn)
		snprintf(buf, MSGLEN+1, "T:%*d\t%s", maxturn_width, turn, output[0]);
	    else
		snprintf(buf, MSGLEN+1, "\t%s", output[0]);
	    add_menu_txt(items, size, icount, buf, MI_TEXT);

	    for (j = 1; j < output_count; j++) {
		snprintf(buf, MSGLEN+1, "\t%s", output[j]);
		add_menu_txt(items, size, icount, buf, MI_TEXT);
	    }

	    ui_free_wrap(output);
	}

	prevturn = turn;
    }

    curses_display_menu_bottom(items, icount, "Message history:", PICK_NONE, NULL);
    free(items);
}